

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parserInternals.c
# Opt level: O3

void xmlCtxtSetDict(xmlParserCtxtPtr ctxt,xmlDictPtr dict)

{
  if (ctxt != (xmlParserCtxtPtr)0x0) {
    if (ctxt->dict != (xmlDictPtr)0x0) {
      xmlDictFree(ctxt->dict);
    }
    xmlDictReference(dict);
    ctxt->dict = dict;
  }
  return;
}

Assistant:

void
xmlCtxtSetDict(xmlParserCtxtPtr ctxt, xmlDictPtr dict) {
    if (ctxt == NULL)
        return;

    if (ctxt->dict != NULL)
        xmlDictFree(ctxt->dict);

    xmlDictReference(dict);
    ctxt->dict = dict;
}